

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesLedSetState(zes_led_handle_t hLed,ze_bool_t enable)

{
  zes_pfnLedSetState_t pfnSetState;
  dditable_t *dditable;
  ze_result_t result;
  ze_bool_t enable_local;
  zes_led_handle_t hLed_local;
  
  if (*(code **)(*(long *)(hLed + 8) + 0xc88) == (code *)0x0) {
    hLed_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hLed_local._4_4_ = (**(code **)(*(long *)(hLed + 8) + 0xc88))(*(undefined8 *)hLed,enable);
  }
  return hLed_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesLedSetState(
        zes_led_handle_t hLed,                          ///< [in] Handle for the component.
        ze_bool_t enable                                ///< [in] Set to TRUE to turn the LED on, FALSE to turn off.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_led_object_t*>( hLed )->dditable;
        auto pfnSetState = dditable->zes.Led.pfnSetState;
        if( nullptr == pfnSetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hLed = reinterpret_cast<zes_led_object_t*>( hLed )->handle;

        // forward to device-driver
        result = pfnSetState( hLed, enable );

        return result;
    }